

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O0

unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>,_true>
 __thiscall
duckdb::FunctionBinder::BindAggregateFunction
          (FunctionBinder *this,AggregateFunction *bound_function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children,
          unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *filter,
          AggregateType aggr_type)

{
  size_type a;
  size_type b;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  *in_RCX;
  long in_RDX;
  long in_RSI;
  unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
  in_RDI;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> bind_info;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_000000b0;
  SimpleFunction *in_stack_000000b8;
  FunctionBinder *in_stack_000000c0;
  AggregateType *in_stack_00000108;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
  *in_stack_00000110;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *in_stack_00000118;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *in_stack_00000120;
  AggregateFunction *in_stack_00000128;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
  *in_stack_ffffffffffffff70;
  _Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false> this_00;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> local_40 [8];
  
  this_00._M_head_impl =
       (BoundAggregateExpression *)
       in_RDI._M_t.
       super___uniq_ptr_impl<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundAggregateExpression_*,_std::default_delete<duckdb::BoundAggregateExpression>_>
       .super__Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false>._M_head_impl;
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             0x2a57753);
  if (*(long *)(in_RDX + 0xf0) != 0) {
    (**(code **)(in_RDX + 0xf0))(local_40,*(undefined8 *)(in_RSI + 8),in_RDX,in_RCX);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator=
              (in_stack_ffffffffffffff70,local_40);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               0x2a577a5);
    a = ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                  ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
                   (in_RDX + 0x48));
    b = ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
        ::size(in_RCX);
    MinValue<unsigned_long>(a,b);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::resize((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              *)this_00._M_head_impl,(size_type)in_RCX);
  }
  CastToFunctionArguments(in_stack_000000c0,in_stack_000000b8,in_stack_000000b0);
  make_uniq<duckdb::BoundAggregateExpression,_duckdb::AggregateFunction,_duckdb::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>,_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_duckdb::unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>,_duckdb::AggregateType_&>
            (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000110,
             in_stack_00000108);
  unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::~unique_ptr
            ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             0x2a57848);
  return (unique_ptr<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
          )(__uniq_ptr_impl<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
            )in_RDI._M_t.
             super___uniq_ptr_impl<duckdb::BoundAggregateExpression,_std::default_delete<duckdb::BoundAggregateExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb::BoundAggregateExpression_*,_std::default_delete<duckdb::BoundAggregateExpression>_>
             .super__Head_base<0UL,_duckdb::BoundAggregateExpression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<BoundAggregateExpression> FunctionBinder::BindAggregateFunction(AggregateFunction bound_function,
                                                                           vector<unique_ptr<Expression>> children,
                                                                           unique_ptr<Expression> filter,
                                                                           AggregateType aggr_type) {
	unique_ptr<FunctionData> bind_info;
	if (bound_function.bind) {
		bind_info = bound_function.bind(context, bound_function, children);
		// we may have lost some arguments in the bind
		children.resize(MinValue(bound_function.arguments.size(), children.size()));
	}

	// check if we need to add casts to the children
	CastToFunctionArguments(bound_function, children);

	return make_uniq<BoundAggregateExpression>(std::move(bound_function), std::move(children), std::move(filter),
	                                           std::move(bind_info), aggr_type);
}